

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

string * __thiscall JSON::unparse_abi_cxx11_(string *__return_storage_ptr__,JSON *this)

{
  bool bVar1;
  string *__n;
  undefined1 local_68 [8];
  Pl_String p;
  allocator<char> local_19;
  JSON *local_18;
  JSON *this_local;
  string *s;
  
  local_18 = this;
  this_local = (JSON *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    p.m._M_t.super___uniq_ptr_impl<Pl_String::Members,_std::default_delete<Pl_String::Members>_>.
    _M_t.super__Tuple_impl<0UL,_Pl_String::Members_*,_std::default_delete<Pl_String::Members>_>.
    super__Head_base<0UL,_Pl_String::Members_*,_false>._M_head_impl._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    __n = __return_storage_ptr__;
    Pl_String::Pl_String((Pl_String *)local_68,"unparse",(Pipeline *)0x0,__return_storage_ptr__);
    write(this,(int)local_68,(void *)0x0,(size_t)__n);
    p.m._M_t.super___uniq_ptr_impl<Pl_String::Members,_std::default_delete<Pl_String::Members>_>.
    _M_t.super__Tuple_impl<0UL,_Pl_String::Members_*,_std::default_delete<Pl_String::Members>_>.
    super__Head_base<0UL,_Pl_String::Members_*,_false>._M_head_impl._3_1_ = 1;
    Pl_String::~Pl_String((Pl_String *)local_68);
    if ((p.m._M_t.
         super___uniq_ptr_impl<Pl_String::Members,_std::default_delete<Pl_String::Members>_>._M_t.
         super__Tuple_impl<0UL,_Pl_String::Members_*,_std::default_delete<Pl_String::Members>_>.
         super__Head_base<0UL,_Pl_String::Members_*,_false>._M_head_impl._3_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
JSON::unparse() const
{
    if (!m) {
        return "null";
    }
    std::string s;
    Pl_String p("unparse", nullptr, s);
    write(&p, 0);
    return s;
}